

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

int32_t __thiscall icu_63::LocalizationInfo::indexForRuleSet(LocalizationInfo *this,UChar *ruleset)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  uint local_24;
  int i;
  UChar *ruleset_local;
  LocalizationInfo *this_local;
  
  if (ruleset != (UChar *)0x0) {
    for (local_24 = 0; iVar2 = (*this->_vptr_LocalizationInfo[3])(), (int)local_24 < iVar2;
        local_24 = local_24 + 1) {
      iVar2 = (*this->_vptr_LocalizationInfo[4])(this,(ulong)local_24);
      UVar1 = streq(ruleset,(UChar *)CONCAT44(extraout_var,iVar2));
      if (UVar1 != '\0') {
        return local_24;
      }
    }
  }
  return -1;
}

Assistant:

int32_t
LocalizationInfo::indexForRuleSet(const UChar* ruleset) const {
    if (ruleset) {
        for (int i = 0; i < getNumberOfRuleSets(); ++i) {
            if (streq(ruleset, getRuleSetName(i))) {
                return i;
            }
        }
    }
    return -1;
}